

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O0

TWords * __thiscall
NJamSpell::TSpellCorrector::GetCandidatesRaw
          (TWords *__return_storage_ptr__,TSpellCorrector *this,TWords *sentence,size_t position)

{
  pointer pTVar1;
  wchar_t *pwVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  size_type __n;
  reference pTVar6;
  iterator iVar7;
  iterator iVar8;
  reference pTVar9;
  TWord TVar10;
  undefined1 auStack_1d8 [8];
  TScoredWord s;
  __normal_iterator<NJamSpell::TScoredWord_*,_std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>_>
  local_1b8;
  iterator __end1_1;
  iterator __begin1_1;
  vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *__range1_1;
  undefined1 auStack_188 [8];
  TScoredWord scored;
  ulong local_168;
  size_t i;
  TWords candSentence;
  TWord cand;
  iterator __end1;
  iterator __begin1;
  unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
  *__range1;
  vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> scoredCandidates;
  allocator<NJamSpell::TWord> local_eb;
  key_equal local_ea;
  hasher local_e9;
  __normal_iterator<NJamSpell::TWord_*,_std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>
  local_e8;
  __normal_iterator<NJamSpell::TWord_*,_std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>
  local_e0;
  undefined1 local_d8 [8];
  unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
  uniqueCandidates;
  wstring local_98 [32];
  undefined1 auStack_78 [8];
  TWord c;
  TWords local_58;
  byte local_3b;
  byte local_3a;
  byte local_39;
  undefined1 auStack_38 [5];
  bool knownWord;
  bool firstLevel;
  TWord w;
  size_t position_local;
  TWords *sentence_local;
  TSpellCorrector *this_local;
  TWords *candidates;
  
  w.Len = position;
  sVar4 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::size(sentence);
  if (position < sVar4) {
    pvVar5 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                       (sentence,w.Len);
    _auStack_38 = (pointer)pvVar5->Ptr;
    w.Ptr = (wchar_t *)pvVar5->Len;
    local_39 = 0;
    Edits2(__return_storage_ptr__,this,(TWord *)auStack_38,true);
    local_3a = 1;
    local_3b = 0;
    bVar3 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::empty
                      (__return_storage_ptr__);
    if (bVar3) {
      Edits(&local_58,this,(TWord *)auStack_38);
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator=
                (__return_storage_ptr__,&local_58);
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector(&local_58);
      local_3a = 0;
    }
    bVar3 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::empty
                      (__return_storage_ptr__);
    pwVar2 = w.Ptr;
    pTVar1 = _auStack_38;
    if (bVar3) {
      local_39 = 1;
      c.Len._0_4_ = 1;
    }
    else {
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring
                (local_98,(wchar_t *)pTVar1,(ulong)pwVar2,
                 (allocator *)((long)&uniqueCandidates._M_h._M_single_bucket + 7));
      TVar10 = TLangModel::GetWord(&this->LangModel,(wstring *)local_98);
      c.Ptr = (wchar_t *)TVar10.Len;
      auStack_78 = (undefined1  [8])TVar10.Ptr;
      std::__cxx11::wstring::~wstring(local_98);
      std::allocator<wchar_t>::~allocator
                ((allocator<wchar_t> *)((long)&uniqueCandidates._M_h._M_single_bucket + 7));
      if ((auStack_78 == (undefined1  [8])0x0) || (c.Ptr == (wchar_t *)0x0)) {
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  (__return_storage_ptr__,(value_type *)auStack_38);
      }
      else {
        _auStack_38 = (pointer)auStack_78;
        w.Ptr = c.Ptr;
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  (__return_storage_ptr__,(value_type *)auStack_78);
        local_3b = 1;
      }
      local_e0._M_current =
           (TWord *)std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::begin
                              (__return_storage_ptr__);
      local_e8._M_current =
           (TWord *)std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::end
                              (__return_storage_ptr__);
      std::allocator<NJamSpell::TWord>::allocator(&local_eb);
      std::
      unordered_set<NJamSpell::TWord,NJamSpell::TWordHashPtr,std::equal_to<NJamSpell::TWord>,std::allocator<NJamSpell::TWord>>
      ::
      unordered_set<__gnu_cxx::__normal_iterator<NJamSpell::TWord*,std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>>
                ((unordered_set<NJamSpell::TWord,NJamSpell::TWordHashPtr,std::equal_to<NJamSpell::TWord>,std::allocator<NJamSpell::TWord>>
                  *)local_d8,local_e0,local_e8,0,&local_e9,&local_ea,&local_eb);
      std::allocator<NJamSpell::TWord>::~allocator(&local_eb);
      scoredCandidates.
      super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = _auStack_38;
      TVar10.Len = (size_t)w.Ptr;
      TVar10.Ptr = (wchar_t *)_auStack_38;
      FilterCandidatesByFrequency
                (this,(unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                       *)local_d8,TVar10);
      std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::vector
                ((vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *)
                 &__range1);
      __n = std::
            unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
            ::size((unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                    *)local_d8);
      std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::reserve
                ((vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *)
                 &__range1,__n);
      __end1 = std::
               unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
               ::begin((unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                        *)local_d8);
      cand.Len = (size_t)std::
                         unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                         ::end((unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                                *)local_d8);
      while (bVar3 = std::__detail::operator!=
                               (&__end1.super__Node_iterator_base<NJamSpell::TWord,_true>,
                                (_Node_iterator_base<NJamSpell::TWord,_true> *)&cand.Len), bVar3) {
        pTVar6 = std::__detail::_Node_iterator<NJamSpell::TWord,_true,_true>::operator*(&__end1);
        candSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)pTVar6->Ptr;
        cand.Ptr = (wchar_t *)pTVar6->Len;
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::vector
                  ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&i);
        for (local_168 = 0;
            sVar4 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::size(sentence)
            , local_168 < sVar4; local_168 = local_168 + 1) {
          if (local_168 == w.Len) {
            std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                      ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&i,
                       (value_type *)
                       &candSentence.
                        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else if (((local_168 < w.Len) && (w.Len <= local_168 + 2)) ||
                  ((w.Len < local_168 && (local_168 <= w.Len + 2)))) {
            pvVar5 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                               (sentence,local_168);
            std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                      ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&i,pvVar5);
          }
        }
        TScoredWord::TScoredWord((TScoredWord *)auStack_188);
        auStack_188 = (undefined1  [8])
                      candSentence.
                      super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
        scored.Word.Ptr = cand.Ptr;
        scored.Word.Len = (size_t)TLangModel::Score(&this->LangModel,(TWords *)&i);
        bVar3 = TWord::operator==((TWord *)auStack_188,(TWord *)auStack_38);
        if (!bVar3) {
          if ((local_3b & 1) == 0) {
            scored.Word.Len = (size_t)((double)scored.Word.Len - this->UnknownWordsPenalty);
          }
          else if ((local_3a & 1) == 0) {
            scored.Word.Len = (size_t)((double)scored.Word.Len * 50.0);
          }
          else {
            scored.Word.Len = (size_t)((double)scored.Word.Len - this->KnownWordsPenalty);
          }
        }
        std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::push_back
                  ((vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *)
                   &__range1,(value_type *)auStack_188);
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector
                  ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&i);
        std::__detail::_Node_iterator<NJamSpell::TWord,_true,_true>::operator++(&__end1);
      }
      iVar7 = std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::begin
                        ((vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *)
                         &__range1);
      iVar8 = std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::end
                        ((vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *)
                         &__range1);
      std::
      sort<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,NJamSpell::TSpellCorrector::GetCandidatesRaw(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>
                (iVar7._M_current,iVar8._M_current);
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::clear
                (__return_storage_ptr__);
      __end1_1 = std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::begin
                           ((vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>
                             *)&__range1);
      local_1b8._M_current =
           (TScoredWord *)
           std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::end
                     ((vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *)
                      &__range1);
      while (bVar3 = __gnu_cxx::operator!=(&__end1_1,&local_1b8), bVar3) {
        pTVar9 = __gnu_cxx::
                 __normal_iterator<NJamSpell::TScoredWord_*,_std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>_>
                 ::operator*(&__end1_1);
        s.Word.Len = (size_t)pTVar9->Score;
        auStack_1d8 = (undefined1  [8])(pTVar9->Word).Ptr;
        s.Word.Ptr = (wchar_t *)(pTVar9->Word).Len;
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  (__return_storage_ptr__,(value_type *)auStack_1d8);
        __gnu_cxx::
        __normal_iterator<NJamSpell::TScoredWord_*,_std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>_>
        ::operator++(&__end1_1);
      }
      local_39 = 1;
      c.Len._0_4_ = 1;
      std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::~vector
                ((vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *)
                 &__range1);
      std::
      unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
      ::~unordered_set((unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                        *)local_d8);
    }
    if ((local_39 & 1) == 0) {
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector
                (__return_storage_ptr__);
    }
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::vector(__return_storage_ptr__)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

TWords TSpellCorrector::GetCandidatesRaw(const TWords& sentence, size_t position) const {
    if (position >= sentence.size()) {
        return TWords();
    }

    TWord w = sentence[position];

    TWords candidates = Edits2(w);

    bool firstLevel = true;
    bool knownWord = false;
    if (candidates.empty()) {
        candidates = Edits(w);
        firstLevel = false;
    }

    if (candidates.empty()) {
        return candidates;
    }

    {
        TWord c = LangModel.GetWord(std::wstring(w.Ptr, w.Len));
        if (c.Ptr && c.Len) {
            w = c;
            candidates.push_back(c);
            knownWord = true;
        } else {
            candidates.push_back(w);
        }
    }

    std::unordered_set<TWord, TWordHashPtr> uniqueCandidates(candidates.begin(), candidates.end());

    FilterCandidatesByFrequency(uniqueCandidates, w);

    std::vector<TScoredWord> scoredCandidates;
    scoredCandidates.reserve(uniqueCandidates.size());

    for (TWord cand: uniqueCandidates) {
        TWords candSentence;
        for (size_t i = 0; i < sentence.size(); ++i) {
            if (i == position) {
                candSentence.push_back(cand);
            } else if ((i < position && i + 2 >= position) ||
                       (i > position && i <= position + 2))
            {
                candSentence.push_back(sentence[i]);
            }
        }

        TScoredWord scored;
        scored.Word = cand;
        scored.Score = LangModel.Score(candSentence);
        if (!(scored.Word == w)) {
            if (knownWord) {
                if (firstLevel) {
                    scored.Score -= KnownWordsPenalty;
                } else {
                    scored.Score *= 50.0;
                }
            } else {
                scored.Score -= UnknownWordsPenalty;
            }
        }
        scoredCandidates.push_back(scored);
    }

    std::sort(scoredCandidates.begin(), scoredCandidates.end(), [](TScoredWord w1, TScoredWord w2) {
        return w1.Score > w2.Score;
    });

    candidates.clear();
    for (auto s: scoredCandidates) {
        candidates.push_back(s.Word);
    }
    return candidates;
}